

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::dump
          (ControlPacketSerializableImpl *this,FastString *out,int indent)

{
  ControlPacketType type;
  uint32 uVar1;
  char *pcVar2;
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  ControlPacketSerializableImpl *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  type = (**this->header->_vptr_FixedHeaderBase)();
  pcVar2 = Common::Helper::getControlPacketName(type);
  uVar1 = Common::VBInt::operator_cast_to_unsigned_int(&this->remLength);
  MQTTStringPrintf((char *)&local_30,"%*s%s control packet (rlength: %u)\n",(ulong)(uint)indent,"",
                   pcVar2,(ulong)uVar1);
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  (*this->header->_vptr_FixedHeaderBase[3])(this->header,pFStack_18,(ulong)(local_1c + 2));
  (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[3])
            (this->fixedVariableHeader,pFStack_18,(ulong)(local_1c + 2));
  (*(this->props->super_Serializable)._vptr_Serializable[3])
            (this->props,pFStack_18,(ulong)(local_1c + 2));
  (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable[3])
            (this->payload,pFStack_18,(ulong)(local_1c + 2));
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*s%s control packet (rlength: %u)\n", (int)indent, "", Helper::getControlPacketName(header.getType()), (uint32)remLength);
                    header.dump(out, indent + 2);
                    fixedVariableHeader.dump(out, indent + 2);
                    props.dump(out, indent + 2);
                    payload.dump(out, indent + 2);
                }